

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O1

UndoBufferReference * __thiscall
duckdb::UndoBuffer::CreateEntry
          (UndoBufferReference *__return_storage_ptr__,UndoBuffer *this,UndoFlags type,idx_t len)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  ulong alloc_len;
  
  alloc_len = len + 0xf & 0xfffffffffffffff8;
  UndoBufferAllocator::Allocate(__return_storage_ptr__,&this->allocator,alloc_len);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(__return_storage_ptr__->handle).node);
  iVar1 = __return_storage_ptr__->position;
  pdVar2 = ((__return_storage_ptr__->handle).node.ptr)->buffer;
  *(UndoFlags *)(pdVar2 + iVar1) = type;
  *(int *)(pdVar2 + iVar1 + 4) = (int)alloc_len + -8;
  __return_storage_ptr__->position = __return_storage_ptr__->position + 8;
  return __return_storage_ptr__;
}

Assistant:

UndoBufferReference UndoBuffer::CreateEntry(UndoFlags type, idx_t len) {
	idx_t alloc_len = AlignValue<idx_t>(len + UNDO_ENTRY_HEADER_SIZE);
	auto handle = allocator.Allocate(alloc_len);
	auto data = handle.Ptr();
	// write the undo entry metadata
	Store<UndoFlags>(type, data);
	data += sizeof(UndoFlags);
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(alloc_len - UNDO_ENTRY_HEADER_SIZE), data);
	// increment the position of the header past the undo entry metadata
	handle.position += UNDO_ENTRY_HEADER_SIZE;
	return handle;
}